

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_lock.hpp
# Opt level: O1

void __thiscall unodb::optimistic_lock::version_type::dump(version_type *this,ostream *os)

{
  long lVar1;
  long lVar2;
  ostream oVar3;
  ostream *poVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"version = 0x",0xc);
  lVar1 = *(long *)os;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xffffffb5 | 8;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar4 = os + lVar1;
  if (os[lVar1 + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar4);
    poVar4[0xe0] = oVar3;
    poVar4[0xe1] = (ostream)0x1;
  }
  poVar4[0xe0] = (ostream)0x30;
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 8;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
  if ((this->version & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (write locked)",0xf);
  }
  if (this->version == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os," (obsoleted)",0xc);
    return;
  }
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream &os) const {
      os << "version = 0x" << std::hex << std::setfill('0') << std::setw(8)
         << version << std::dec;
      if (is_write_locked()) os << " (write locked)";
      if (is_obsolete()) os << " (obsoleted)";
    }